

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_SimpleTokens_DD_SimpleTokens_Test::TestBody
          (TokenizerTest_SimpleTokens_DD_SimpleTokens_Test *this)

{
  Message *pMVar1;
  Message local_28;
  ScopedTrace local_19;
  uint local_18;
  uint uStack_14;
  ScopedTrace gtest_trace_225;
  int j;
  int i;
  TokenizerTest_SimpleTokens_DD_SimpleTokens_Test *this_local;
  
  for (uStack_14 = 0; uStack_14 < 0x1e; uStack_14 = uStack_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      testing::Message::Message(&local_28);
      pMVar1 = testing::Message::operator<<(&local_28,(char (*) [25])"kSimpleTokenCases case #");
      pMVar1 = testing::Message::operator<<(pMVar1,(int *)&stack0xffffffffffffffec);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x20d8522);
      pMVar1 = testing::Message::operator<<
                         (pMVar1,(SimpleTokenCase *)
                                 (io::(anonymous_namespace)::kSimpleTokenCases +
                                 (long)(int)uStack_14 * 0x28));
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x1fe663c);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [19])"kBlockSizes case #");
      pMVar1 = testing::Message::operator<<(pMVar1,(int *)&local_18);
      pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [3])0x20d8522);
      pMVar1 = testing::Message::operator<<
                         (pMVar1,(int *)(io::(anonymous_namespace)::kBlockSizes +
                                        (long)(int)local_18 * 4));
      testing::ScopedTrace::ScopedTrace<testing::Message>
                (&local_19,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xe1,pMVar1);
      testing::Message::~Message(&local_28);
      io::(anonymous_namespace)::TokenizerTest_SimpleTokens_DD::
      DoSingleCase<google::protobuf::io::(anonymous_namespace)::SimpleTokenCase,int>
                ((TokenizerTest_SimpleTokens_DD *)this,
                 (SimpleTokenCase *)
                 (io::(anonymous_namespace)::kSimpleTokenCases + (long)(int)uStack_14 * 0x28),
                 (int *)(io::(anonymous_namespace)::kBlockSizes + (long)(int)local_18 * 4));
      testing::ScopedTrace::~ScopedTrace(&local_19);
    }
  }
  return;
}

Assistant:

TEST_2D(TokenizerTest, SimpleTokens, kSimpleTokenCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kSimpleTokenCases_case.input.data(),
                        kSimpleTokenCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Before Next() is called, the initial token should always be TYPE_START.
  EXPECT_EQ(Tokenizer::TYPE_START, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(0, tokenizer.current().end_column);

  // Parse the token.
  ASSERT_TRUE(tokenizer.Next());

  // Check that it has the right type.
  EXPECT_EQ(kSimpleTokenCases_case.type, tokenizer.current().type);
  // Check that it contains the complete input text.
  EXPECT_EQ(kSimpleTokenCases_case.input, tokenizer.current().text);
  // Check that it is located at the beginning of the input
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no more input.
  EXPECT_FALSE(tokenizer.Next());

  // After Next() returns false, the token should have type TYPE_END.
  EXPECT_EQ(Tokenizer::TYPE_END, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(), tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no errors.
  EXPECT_TRUE(error_collector.text_.empty());
}